

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

int ON_DBL::CompareValue(double lhs,double rhs)

{
  int iVar1;
  
  iVar1 = -1;
  if ((rhs <= lhs) && (iVar1 = 1, lhs <= rhs)) {
    iVar1 = 0;
    if ((lhs != rhs) || (NAN(lhs) || NAN(rhs))) {
      return (uint)NAN(lhs) - (uint)NAN(rhs);
    }
  }
  return iVar1;
}

Assistant:

int ON_DBL::CompareValue(double lhs, double rhs)
{
  if (lhs < rhs)
    return -1;
  if (lhs > rhs)
    return 1;
  if (lhs == rhs)
    return 0; 

  // At least one of lhs or rhs is a nan. Sort nans to end
  return (ON_IS_NAN(lhs) ? 1 : 0) - (ON_IS_NAN(rhs) ? 1 : 0);
}